

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall
CLI::OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
          (OptionBase<CLI::OptionDefaults> *this,Option *other)

{
  pointer pcVar1;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (this->group_)._M_dataplus._M_p;
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->group_)._M_string_length);
  ::std::__cxx11::string::_M_assign((string *)other);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  (other->super_OptionBase<CLI::Option>).required_ = this->required_;
  Option::ignore_case<CLI::App>(other,this->ignore_case_);
  (other->super_OptionBase<CLI::Option>).configurable_ = this->configurable_;
  Option::multi_option_policy(other,this->multi_option_policy_);
  return;
}

Assistant:

void copy_to(T *other) const {
        other->group(group_);
        other->required(required_);
        other->ignore_case(ignore_case_);
        other->configurable(configurable_);
        other->multi_option_policy(multi_option_policy_);
    }